

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateOpArrayLength
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  uint32_t uVar1;
  uint32_t member_idx;
  DefUseManager *pDVar2;
  Instruction *pIVar3;
  initializer_list<unsigned_int> init_list;
  uint32_t local_54;
  SmallVector<unsigned_int,_2UL> local_50;
  
  uVar1 = Instruction::GetSingleWordInOperand(inst,0);
  pDVar2 = Pass::get_def_use_mgr((Pass *)this);
  pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
  uVar1 = Instruction::type_id(pIVar3);
  pDVar2 = Pass::get_def_use_mgr((Pass *)this);
  pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
  uVar1 = Instruction::GetSingleWordInOperand(pIVar3,1);
  member_idx = Instruction::GetSingleWordInOperand(inst,1);
  uVar1 = GetNewMemberIndex(this,uVar1,member_idx);
  if (uVar1 != 0xffffffff) {
    if (member_idx != uVar1) {
      init_list._M_len = 1;
      init_list._M_array = &local_54;
      local_54 = uVar1;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_50,init_list);
      Instruction::SetInOperand(inst,1,&local_50);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_50);
      IRContext::UpdateDefUse((this->super_MemPass).super_Pass.context_,inst);
    }
    return member_idx != uVar1;
  }
  __assert_fail("new_member_idx != kRemovedMember",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0x2ae,
                "bool spvtools::opt::EliminateDeadMembersPass::UpdateOpArrayLength(Instruction *)");
}

Assistant:

bool EliminateDeadMembersPass::UpdateOpArrayLength(Instruction* inst) {
  uint32_t struct_id = inst->GetSingleWordInOperand(0);
  Instruction* struct_inst = get_def_use_mgr()->GetDef(struct_id);
  uint32_t pointer_type_id = struct_inst->type_id();
  Instruction* pointer_type_inst = get_def_use_mgr()->GetDef(pointer_type_id);
  uint32_t type_id = pointer_type_inst->GetSingleWordInOperand(1);

  uint32_t member_idx = inst->GetSingleWordInOperand(1);
  uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);
  assert(new_member_idx != kRemovedMember);

  if (member_idx == new_member_idx) {
    return false;
  }

  inst->SetInOperand(1, {new_member_idx});
  context()->UpdateDefUse(inst);
  return true;
}